

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

MatchFlags __thiscall QComboBoxPrivate::matchFlags(QComboBoxPrivate *this)

{
  CaseSensitivity CVar1;
  QCompleter *pQVar2;
  
  pQVar2 = QLineEdit::completer(this->lineEdit);
  if (pQVar2 != (QCompleter *)0x0) {
    pQVar2 = QLineEdit::completer(this->lineEdit);
    CVar1 = QCompleter::caseSensitivity(pQVar2);
    if (CVar1 != CaseSensitive) {
      return (MatchFlags)8;
    }
  }
  return (QFlagsStorageHelper<Qt::MatchFlag,_4>)(QFlagsStorage<Qt::MatchFlag>)0x18;
}

Assistant:

Qt::MatchFlags QComboBoxPrivate::matchFlags() const
{
    // Base how duplicates are determined on the autocompletion case sensitivity
    Qt::MatchFlags flags = Qt::MatchFixedString;
#if QT_CONFIG(completer)
    if (!lineEdit->completer() || lineEdit->completer()->caseSensitivity() == Qt::CaseSensitive)
#endif
        flags |= Qt::MatchCaseSensitive;
    return flags;
}